

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::ULTRA_HIGH(Parser *this)

{
  bool bVar1;
  Lex local_1c;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  ULTRA_ULTRA_HIGH(this);
  while( true ) {
    bVar1 = true;
    if (this->c_type != LEX_TIMES) {
      bVar1 = this->c_type == LEX_SLASH;
    }
    if (!bVar1) break;
    Lex::Lex(&local_1c,this->c_type,0,0);
    std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::push(&this->lex_stack,&local_1c);
    Lex::~Lex(&local_1c);
    get_lex(this);
    ULTRA_ULTRA_HIGH(this);
    check_op(this);
  }
  return;
}

Assistant:

void Parser::ULTRA_HIGH() {
    ULTRA_ULTRA_HIGH();
    while ( c_type == LEX_TIMES || c_type == LEX_SLASH) {
        lex_stack.push (c_type);
        get_lex();
        ULTRA_ULTRA_HIGH();
        check_op();
    }
}